

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::ClearIncrementalState
          (ProducerEndpointImpl *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *data_sources)

{
  TaskRunner *pTVar1;
  anon_class_40_2_a58e0b3e local_70;
  function<void_()> local_48;
  undefined1 local_28 [8];
  WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> weak_this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *data_sources_local;
  ProducerEndpointImpl *this_local;
  
  weak_this.handle_.
  super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data_sources;
  perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ProducerEndpointImpl>::GetWeakPtr
            ((WeakPtrFactory<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_28);
  pTVar1 = this->task_runner_;
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl>::WeakPtr
            (&local_70.weak_this,
             (WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70.data_sources,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             weak_this.handle_.
             super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  ::std::function<void()>::
  function<perfetto::TracingServiceImpl::ProducerEndpointImpl::ClearIncrementalState(std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::__0,void>
            ((function<void()> *)&local_48,&local_70);
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1,&local_48);
  ::std::function<void_()>::~function(&local_48);
  ClearIncrementalState(std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::$_0::~__0
            ((__0 *)&local_70);
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl>::~WeakPtr
            ((WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_28);
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::ClearIncrementalState(
    const std::vector<DataSourceInstanceID>& data_sources) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, data_sources] {
    if (weak_this) {
      base::StringView producer_name(weak_this->name_);
      weak_this->producer_->ClearIncrementalState(data_sources.data(),
                                                  data_sources.size());
    }
  });
}